

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O2

znzFile nifti_image_write_hdr_img2
                  (nifti_image *nim,int write_opts,char *opts,znzFile imgfile,nifti_brick_list *NBL)

{
  char *__s1;
  int iVar1;
  ulong uVar2;
  znzFile pzVar3;
  char *pcVar4;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  uint write_data;
  ulong uVar9;
  znzFile file;
  nifti_brick_list *NBL_00;
  uint uVar10;
  znzFile local_1d0;
  nifti_brick_list *local_1c8;
  char *local_1c0;
  uint local_1b4;
  znzFile local_1b0;
  char func [27];
  nifti_1_header local_18c;
  
  builtin_strncpy(func + 0x10,"e_hdr_img2",0xb);
  builtin_strncpy(func,"nifti_image_writ",0x10);
  local_1c0 = opts;
  if (nim == (nifti_image *)0x0) {
    pcVar4 = "NULL input";
    goto LAB_00117399;
  }
  iVar1 = nifti_validfilename(nim->fname);
  if (iVar1 == 0) {
    pcVar4 = "bad fname input";
    goto LAB_00117399;
  }
  write_data = write_opts & 1;
  local_1b0 = imgfile;
  if (write_data != 0) {
    if (nim->data == (void *)0x0 && NBL == (nifti_brick_list *)0x0) {
      pcVar4 = "no image data";
      goto LAB_00117399;
    }
    if (NBL != (nifti_brick_list *)0x0) {
      uVar2 = (ulong)(uint)nim->ndim;
      if (nim->ndim < 1) {
        uVar9 = 0;
        uVar10 = 0;
      }
      else {
        uVar9 = (ulong)nim->nbyper;
        uVar6 = 3;
        if (uVar2 < 3) {
          uVar6 = uVar2;
        }
        for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
          uVar9 = uVar9 * (long)nim->dim[uVar8 + 1];
        }
        uVar10 = 1;
        for (lVar7 = 0xc; lVar7 - 8U <= uVar2; lVar7 = lVar7 + 1) {
          uVar10 = uVar10 * nim->dim[lVar7 + -8];
        }
      }
      uVar2 = NBL->bsize;
      local_1b4 = write_data;
      if ((uVar9 != uVar2) && (1 < g_opts_0)) {
        fprintf(_stderr,"** NBL/nim mismatch, volbytes = %u, %u\n",uVar2 & 0xffffffff);
      }
      write_data = local_1b4;
      if (uVar10 == NBL->nbricks) {
        if (uVar9 == uVar2) {
          if (2 < g_opts_0) {
            fprintf(_stderr,"-- nim/NBL agree: nvols = %d, nbytes = %u\n",(ulong)uVar10);
          }
          goto LAB_00117010;
        }
      }
      else if (1 < g_opts_0) {
        fprintf(_stderr,"** NBL/nim mismatch, nvols = %d, %d\n",(ulong)(uint)NBL->nbricks,
                (ulong)uVar10);
      }
      pcVar4 = "NBL does not match nim";
LAB_00117399:
      fprintf(_stderr,"** ERROR: nifti_image_write_hdr_img: %s\n",pcVar4);
      return (znzFile)0x0;
    }
  }
LAB_00117010:
  local_1c8 = NBL;
  nifti_set_iname_offset(nim);
  if ((1 < g_opts_0) &&
     (fprintf(_stderr,"-d writing nifti file \'%s\'...\n",nim->fname), 2 < g_opts_0)) {
    fprintf(_stderr,"-d nifti type %d, offset %d\n",(ulong)(uint)nim->nifti_type);
  }
  iVar1 = nim->nifti_type;
  if (iVar1 == 3) {
    pzVar3 = nifti_write_ascii_image(nim,local_1c8,local_1c0,write_data,write_opts & 2U);
    return pzVar3;
  }
  nifti_convert_nim2nhdr(&local_18c,nim);
  if (iVar1 != 1) {
    pcVar4 = nim->fname;
    __s1 = nim->iname;
    if (__s1 != (char *)0x0) {
      iVar1 = strcmp(__s1,pcVar4);
      if (iVar1 != 0) goto LAB_001170d9;
      free(__s1);
      nim->iname = (char *)0x0;
      pcVar4 = nim->fname;
      iVar1 = nim->nifti_type;
    }
    pcVar4 = nifti_makeimgname(pcVar4,iVar1,0,0);
    nim->iname = pcVar4;
    if (pcVar4 == (char *)0x0) {
      return (znzFile)0x0;
    }
  }
LAB_001170d9:
  pzVar3 = local_1b0;
  if ((local_1b0 == (znzFile)0x0) || (nim->nifti_type != 1)) {
    pcVar4 = nim->fname;
    if (2 < g_opts_0) {
      fprintf(_stderr,"+d opening output file %s [%s]\n",pcVar4,local_1c0);
      pcVar4 = nim->fname;
    }
    iVar1 = nifti_is_gzfile(pcVar4);
    local_1d0 = znzopen(pcVar4,local_1c0,iVar1);
    file = local_1d0;
    if (local_1d0 == (znzFile)0x0) {
      fprintf(_stderr,"** ERROR (%s): %s \'%s\'\n",func,"cannot open output file",nim->fname);
      return (znzFile)0x0;
    }
  }
  else {
    file = pzVar3;
    if (2 < g_opts_0) {
      fwrite("+d using passed file for hdr\n",0x1d,1,_stderr);
    }
  }
  local_1d0 = file;
  sVar5 = znzwrite(&local_18c,1,0x15c,file);
  if (sVar5 < 0x15c) {
    fprintf(_stderr,"** ERROR (%s): %s \'%s\'\n",func,"bad header write to output file",nim->fname);
  }
  else {
    if (nim->nifti_type != 0) {
      nifti_write_extensions(file,nim);
    }
    if ((write_opts & 3U) != 0) {
      NBL_00 = local_1c8;
      if (nim->nifti_type != 1) {
        Xznzclose(&local_1d0);
        NBL_00 = local_1c8;
        if (pzVar3 == (znzFile)0x0) {
          if (2 < g_opts_0) {
            fprintf(_stderr,"+d opening img file \'%s\'\n",nim->iname);
          }
          pcVar4 = nim->iname;
          iVar1 = nifti_is_gzfile(pcVar4);
          local_1d0 = znzopen(pcVar4,local_1c0,iVar1);
          NBL_00 = local_1c8;
          if (local_1d0 == (znzFile)0x0) {
            fprintf(_stderr,"** ERROR: nifti_image_write_hdr_img: %s\n","cannot open image file");
            return local_1d0;
          }
        }
        else {
          if (2 < g_opts_0) {
            fwrite("+d using passed file for img\n",0x1d,1,_stderr);
          }
          local_1d0 = pzVar3;
        }
      }
      znzseek(local_1d0,(long)nim->iname_offset,0);
      if (write_data != 0) {
        nifti_write_all_data(local_1d0,nim,NBL_00);
      }
      if ((write_opts & 2U) != 0) {
        return local_1d0;
      }
      Xznzclose(&local_1d0);
      return local_1d0;
    }
    if (2 < g_opts_0) {
      fwrite("-d header is all we want: done\n",0x1f,1,_stderr);
    }
  }
  Xznzclose(&local_1d0);
  return local_1d0;
}

Assistant:

znzFile nifti_image_write_hdr_img2(nifti_image *nim, int write_opts,
               const char * opts, znzFile imgfile, const nifti_brick_list * NBL)
{
   struct nifti_1_header nhdr ;
   znzFile               fp=NULL;
   size_t                ss ;
   int                   write_data, leave_open;
   char                  func[] = { "nifti_image_write_hdr_img2" };

   write_data = write_opts & 1;  /* just separate the bits now */
   leave_open = write_opts & 2;

   if( ! nim                              ) ERREX("NULL input") ;
   if( ! nifti_validfilename(nim->fname)  ) ERREX("bad fname input") ;
   if( write_data && ! nim->data && ! NBL ) ERREX("no image data") ;

   if( write_data && NBL && ! nifti_NBL_matches_nim(nim, NBL) )
      ERREX("NBL does not match nim");

   nifti_set_iname_offset(nim);

   if( g_opts.debug > 1 ){
      fprintf(stderr,"-d writing nifti file '%s'...\n", nim->fname);
      if( g_opts.debug > 2 )
         fprintf(stderr,"-d nifti type %d, offset %d\n",
                 nim->nifti_type, nim->iname_offset);
   }

   if( nim->nifti_type == NIFTI_FTYPE_ASCII )   /* non-standard case */
      return nifti_write_ascii_image(nim,NBL,opts,write_data,leave_open);

   nhdr = nifti_convert_nim2nhdr(nim);    /* create the nifti1_header struct */

   /* if writing to 2 files, make sure iname is set and different from fname */
   if( nim->nifti_type != NIFTI_FTYPE_NIFTI1_1 ){
       if( nim->iname && strcmp(nim->iname,nim->fname) == 0 ){
         free(nim->iname) ; nim->iname = NULL ;
       }
       if( nim->iname == NULL ){ /* then make a new one */
         nim->iname = nifti_makeimgname(nim->fname,nim->nifti_type,0,0);
         if( nim->iname == NULL ) return NULL;
       }
   }

   /* if we have an imgfile and will write the header there, use it */
   if( ! znz_isnull(imgfile) && nim->nifti_type == NIFTI_FTYPE_NIFTI1_1 ){
      if( g_opts.debug > 2 ) fprintf(stderr,"+d using passed file for hdr\n");
      fp = imgfile;
   }
   else {
      if( g_opts.debug > 2 )
         fprintf(stderr,"+d opening output file %s [%s]\n",nim->fname,opts);
      fp = znzopen( nim->fname , opts , nifti_is_gzfile(nim->fname) ) ;
      if( znz_isnull(fp) ){
         LNI_FERR(func,"cannot open output file",nim->fname);
         return fp;
      }
   }

   /* write the header and extensions */

   ss = znzwrite(&nhdr , 1 , sizeof(nhdr) , fp); /* write header */
   if( ss < sizeof(nhdr) ){
      LNI_FERR(func,"bad header write to output file",nim->fname);
      znzclose(fp); return fp;
   }

   /* partial file exists, and errors have been printed, so ignore return */
   if( nim->nifti_type != NIFTI_FTYPE_ANALYZE )
      (void)nifti_write_extensions(fp,nim);

   /* if the header is all we want, we are done */
   if( ! write_data && ! leave_open ){
      if( g_opts.debug > 2 ) fprintf(stderr,"-d header is all we want: done\n");
      znzclose(fp); return(fp);
   }

   if( nim->nifti_type != NIFTI_FTYPE_NIFTI1_1 ){ /* get a new file pointer */
      znzclose(fp);         /* first, close header file */
      if( ! znz_isnull(imgfile) ){
         if(g_opts.debug > 2) fprintf(stderr,"+d using passed file for img\n");
         fp = imgfile;
      }
      else {
         if( g_opts.debug > 2 )
            fprintf(stderr,"+d opening img file '%s'\n", nim->iname);
         fp = znzopen( nim->iname , opts , nifti_is_gzfile(nim->iname) ) ;
         if( znz_isnull(fp) ) ERREX("cannot open image file") ;
      }
   }

   znzseek(fp, nim->iname_offset, SEEK_SET);  /* in any case, seek to offset */

   if( write_data ) nifti_write_all_data(fp,nim,NBL);
   if( ! leave_open ) znzclose(fp);

   return fp;
}